

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

void __thiscall
crunch::print_texture_info
          (crunch *this,char *pTex_desc,convert_params *params,mipmapped_texture *tex)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pixel_format fmt;
  component_flags cVar6;
  char *pcVar7;
  char *this_00;
  console *this_01;
  mipmapped_texture *tex_local;
  convert_params *params_local;
  char *pTex_desc_local;
  crunch *this_local;
  
  uVar2 = crnlib::mipmapped_texture::get_width(tex);
  uVar3 = crnlib::mipmapped_texture::get_height(tex);
  uVar4 = crnlib::mipmapped_texture::get_num_levels(tex);
  uVar5 = crnlib::mipmapped_texture::get_num_faces(tex);
  fmt = crnlib::mipmapped_texture::get_format(tex);
  pcVar7 = crnlib::pixel_format_helpers::get_pixel_format_string(fmt);
  this_00 = "%s: %ux%u, Levels: %u, Faces: %u, Format: %s";
  crnlib::console::info
            ("%s: %ux%u, Levels: %u, Faces: %u, Format: %s",pTex_desc,(ulong)uVar2,(ulong)uVar3,
             (ulong)uVar4,(ulong)uVar5,pcVar7);
  crnlib::console::disable_crlf((console *)this_00);
  pcVar7 = crnlib::get_texture_type_desc(params->m_texture_type);
  crnlib::console::info("Apparent type: %s, ",pcVar7);
  crnlib::console::info("Flags: ");
  cVar6 = crnlib::mipmapped_texture::get_comp_flags(tex);
  if ((cVar6 & cCompFlagRValid) != 0) {
    crnlib::console::info("R ");
  }
  cVar6 = crnlib::mipmapped_texture::get_comp_flags(tex);
  if ((cVar6 & cCompFlagGValid) != 0) {
    crnlib::console::info("G ");
  }
  cVar6 = crnlib::mipmapped_texture::get_comp_flags(tex);
  if ((cVar6 & cCompFlagBValid) != 0) {
    crnlib::console::info("B ");
  }
  cVar6 = crnlib::mipmapped_texture::get_comp_flags(tex);
  if ((cVar6 & cCompFlagAValid) != 0) {
    crnlib::console::info("A ");
  }
  cVar6 = crnlib::mipmapped_texture::get_comp_flags(tex);
  if ((cVar6 & cCompFlagGrayscale) != 0) {
    crnlib::console::info("Grayscale ");
  }
  cVar6 = crnlib::mipmapped_texture::get_comp_flags(tex);
  if ((cVar6 & cCompFlagNormalMap) != 0) {
    crnlib::console::info("NormalMap ");
  }
  cVar6 = crnlib::mipmapped_texture::get_comp_flags(tex);
  if ((cVar6 & cCompFlagLumaChroma) != 0) {
    crnlib::console::info("LumaChroma ");
  }
  bVar1 = crnlib::mipmapped_texture::is_flipped(tex);
  if (bVar1) {
    crnlib::console::info("Flipped ");
  }
  else {
    crnlib::console::info("Non-Flipped ");
  }
  this_01 = (console *)0x2296e6;
  crnlib::console::info("\n");
  crnlib::console::enable_crlf(this_01);
  return;
}

Assistant:

void print_texture_info(const char* pTex_desc, texture_conversion::convert_params& params, mipmapped_texture& tex)
    {
        console::info("%s: %ux%u, Levels: %u, Faces: %u, Format: %s",
            pTex_desc,
            tex.get_width(),
            tex.get_height(),
            tex.get_num_levels(),
            tex.get_num_faces(),
            pixel_format_helpers::get_pixel_format_string(tex.get_format()));

        console::disable_crlf();
        console::info("Apparent type: %s, ", get_texture_type_desc(params.m_texture_type));

        console::info("Flags: ");
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagRValid)
        {
            console::info("R ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagGValid)
        {
            console::info("G ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagBValid)
        {
            console::info("B ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagAValid)
        {
            console::info("A ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale)
        {
            console::info("Grayscale ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagNormalMap)
        {
            console::info("NormalMap ");
        }
        if (tex.get_comp_flags() & pixel_format_helpers::cCompFlagLumaChroma)
        {
            console::info("LumaChroma ");
        }
        if (tex.is_flipped())
        {
            console::info("Flipped ");
        }
        else
        {
            console::info("Non-Flipped ");
        }
        console::info("\n");
        console::enable_crlf();
    }